

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

UBool __thiscall
icu_63::NFSubstitution::doParse
          (NFSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,double baseValue,
          double upperBound,UBool lenientParse,uint32_t nonNumericalExecutedRuleMask,
          Formattable *result)

{
  UBool UVar1;
  int32_t iVar2;
  double upperBound_00;
  double dVar3;
  double d;
  double tempResult;
  NumberFormat *pNStack_58;
  UErrorCode status_1;
  NumberFormat *fmt;
  Formattable *pFStack_48;
  UErrorCode status;
  Formattable *result_local;
  uint32_t nonNumericalExecutedRuleMask_local;
  UBool lenientParse_local;
  double upperBound_local;
  double baseValue_local;
  ParsePosition *parsePosition_local;
  UnicodeString *text_local;
  NFSubstitution *this_local;
  
  pFStack_48 = result;
  result_local._0_4_ = nonNumericalExecutedRuleMask;
  result_local._7_1_ = lenientParse;
  _nonNumericalExecutedRuleMask_local = upperBound;
  upperBound_local = baseValue;
  baseValue_local = (double)parsePosition;
  parsePosition_local = (ParsePosition *)text;
  text_local = (UnicodeString *)this;
  (*(this->super_UObject)._vptr_UObject[0xc])(upperBound);
  if (this->ruleSet == (NFRuleSet *)0x0) {
    if (this->numberFormat != (DecimalFormat *)0x0) {
      (*(this->numberFormat->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x14])
                (this->numberFormat,parsePosition_local,pFStack_48,baseValue_local);
    }
  }
  else {
    NFRuleSet::parse(this->ruleSet,(UnicodeString *)parsePosition_local,
                     (ParsePosition *)baseValue_local,upperBound_00,(uint32_t)result_local,
                     pFStack_48);
    if (((result_local._7_1_ != '\0') &&
        (UVar1 = NFRuleSet::isFractionRuleSet(this->ruleSet), UVar1 == '\0')) &&
       (iVar2 = ParsePosition::getIndex((ParsePosition *)baseValue_local), iVar2 == 0)) {
      fmt._4_4_ = U_ZERO_ERROR;
      pNStack_58 = NumberFormat::createInstance((UErrorCode *)((long)&fmt + 4));
      UVar1 = ::U_SUCCESS(fmt._4_4_);
      if (UVar1 != '\0') {
        (*(pNStack_58->super_Format).super_UObject._vptr_UObject[0x14])
                  (pNStack_58,parsePosition_local,pFStack_48,baseValue_local);
      }
      if (pNStack_58 != (NumberFormat *)0x0) {
        (*(pNStack_58->super_Format).super_UObject._vptr_UObject[1])();
      }
    }
  }
  iVar2 = ParsePosition::getIndex((ParsePosition *)baseValue_local);
  if (iVar2 == 0) {
    Formattable::setLong(pFStack_48,0);
  }
  else {
    tempResult._4_4_ = 0;
    dVar3 = Formattable::getDouble(pFStack_48,(UErrorCode *)((long)&tempResult + 4));
    (*(this->super_UObject)._vptr_UObject[0xb])(dVar3,upperBound_local);
    Formattable::setDouble(pFStack_48,d);
  }
  this_local._7_1_ = iVar2 != 0;
  return this_local._7_1_;
}

Assistant:

UBool
NFSubstitution::doParse(const UnicodeString& text,
                        ParsePosition& parsePosition,
                        double baseValue,
                        double upperBound,
                        UBool lenientParse,
                        uint32_t nonNumericalExecutedRuleMask,
                        Formattable& result) const
{
#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfsubs> %x bv: %g ub: %g\n", this, baseValue, upperBound);
#endif
    // figure out the highest base value a rule can have and match
    // the text being parsed (this varies according to the type of
    // substitutions: multiplier, modulus, and numerator substitutions
    // restrict the search to rules with base values lower than their
    // own; same-value substitutions leave the upper bound wherever
    // it was, and the others allow any rule to match
    upperBound = calcUpperBound(upperBound);

    // use our rule set to parse the text.  If that fails and
    // lenient parsing is enabled (this is always false if the
    // formatter's lenient-parsing mode is off, but it may also
    // be false even when the formatter's lenient-parse mode is
    // on), then also try parsing the text using a default-
    // constructed NumberFormat
    if (ruleSet != NULL) {
        ruleSet->parse(text, parsePosition, upperBound, nonNumericalExecutedRuleMask, result);
        if (lenientParse && !ruleSet->isFractionRuleSet() && parsePosition.getIndex() == 0) {
            UErrorCode status = U_ZERO_ERROR;
            NumberFormat* fmt = NumberFormat::createInstance(status);
            if (U_SUCCESS(status)) {
                fmt->parse(text, result, parsePosition);
            }
            delete fmt;
        }

        // ...or use our DecimalFormat to parse the text
    } else if (numberFormat != NULL) {
        numberFormat->parse(text, result, parsePosition);
    }

    // if the parse was successful, we've already advanced the caller's
    // parse position (this is the one function that doesn't have one
    // of its own).  Derive a parse result and return it as a Long,
    // if possible, or a Double
    if (parsePosition.getIndex() != 0) {
        UErrorCode status = U_ZERO_ERROR;
        double tempResult = result.getDouble(status);

        // composeRuleValue() produces a full parse result from
        // the partial parse result passed to this function from
        // the caller (this is either the owning rule's base value
        // or the partial result obtained from composing the
        // owning rule's base value with its other substitution's
        // parse result) and the partial parse result obtained by
        // matching the substitution (which will be the same value
        // the caller would get by parsing just this part of the
        // text with RuleBasedNumberFormat.parse() ).  How the two
        // values are used to derive the full parse result depends
        // on the types of substitutions: For a regular rule, the
        // ultimate result is its multiplier substitution's result
        // times the rule's divisor (or the rule's base value) plus
        // the modulus substitution's result (which will actually
        // supersede part of the rule's base value).  For a negative-
        // number rule, the result is the negative of its substitution's
        // result.  For a fraction rule, it's the sum of its two
        // substitution results.  For a rule in a fraction rule set,
        // it's the numerator substitution's result divided by
        // the rule's base value.  Results from same-value substitutions
        // propagate back upard, and null substitutions don't affect
        // the result.
        tempResult = composeRuleValue(tempResult, baseValue);
        result.setDouble(tempResult);
        return TRUE;
        // if the parse was UNsuccessful, return 0
    } else {
        result.setLong(0);
        return FALSE;
    }
}